

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

char * __thiscall cmsys::RegExpCompile::regatom(RegExpCompile *this,int *flagp)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  int iVar4;
  undefined8 in_RAX;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  uint uVar8;
  char cStack_30;
  int flags;
  
  flags = (int)((ulong)in_RAX >> 0x20);
  *flagp = 0;
  pcVar7 = this->regparse;
  pcVar5 = pcVar7 + 1;
  this->regparse = pcVar5;
  cVar1 = *pcVar7;
  switch(cVar1) {
  case '$':
    cStack_30 = '\x02';
LAB_004ab6b0:
    pcVar5 = regnode(this,cStack_30);
    return pcVar5;
  case '%':
  case '&':
  case '\'':
  case ',':
  case '-':
switchD_004ab683_caseD_25:
    this->regparse = pcVar7;
    sVar6 = strcspn(pcVar7,"^$.[()|?+*\\");
    uVar8 = (uint)sVar6;
    if (0 < (int)uVar8) {
      if (uVar8 == 1) {
        iVar4 = 3;
        sVar6 = 1;
      }
      else {
        iVar4 = 1;
        if (((ulong)(byte)pcVar7[uVar8 & 0x7fffffff] < 0x40) &&
           ((0x80000c0000000000U >> ((ulong)(byte)pcVar7[uVar8 & 0x7fffffff] & 0x3f) & 1) != 0)) {
          sVar6 = (size_t)(uVar8 - 1);
          iVar4 = (uint)(uVar8 - 1 == 1) * 2 + 1;
        }
      }
      *flagp = iVar4;
      pcVar5 = regnode(this,'\b');
      for (; 0 < (int)sVar6; sVar6 = (size_t)((int)sVar6 - 1)) {
        pcVar7 = this->regparse;
        pcVar3 = this->regcode;
        this->regparse = pcVar7 + 1;
        if (pcVar3 == &regdummy) {
          this->regsize = this->regsize + 1;
        }
        else {
          cVar1 = *pcVar7;
          this->regcode = pcVar3 + 1;
          *pcVar3 = cVar1;
        }
      }
      pcVar7 = this->regcode;
      if (pcVar7 == &regdummy) {
        this->regsize = this->regsize + 1;
        return pcVar5;
      }
      this->regcode = pcVar7 + 1;
      *pcVar7 = '\0';
      return pcVar5;
    }
    break;
  case '(':
    pcVar5 = reg(this,1,&flags);
    if (pcVar5 == (char *)0x0) {
      return (char *)0x0;
    }
    *flagp = *flagp | flags & 5U;
    return pcVar5;
  case ')':
    break;
  case '*':
  case '+':
switchD_004ab683_caseD_2a:
    pcVar5 = "RegularExpression::compile(): ?+* follows nothing.";
    goto LAB_004ab704;
  case '.':
    pcVar7 = regnode(this,'\x03');
LAB_004ab99e:
    *(byte *)flagp = (byte)*flagp | 3;
    return pcVar7;
  default:
    if (cVar1 != '\0') {
      if (cVar1 == '?') goto switchD_004ab683_caseD_2a;
      if (cVar1 == '[') {
        if (*pcVar5 == '^') {
          pcVar7 = regnode(this,'\x05');
          pcVar5 = this->regparse + 1;
          this->regparse = pcVar5;
        }
        else {
          pcVar7 = regnode(this,'\x04');
          pcVar5 = this->regparse;
        }
        if ((*pcVar5 == ']') || (*pcVar5 == '-')) {
          this->regparse = pcVar5 + 1;
          pcVar3 = this->regcode;
          if (pcVar3 == &regdummy) {
            this->regsize = this->regsize + 1;
          }
          else {
            cVar1 = *pcVar5;
            this->regcode = pcVar3 + 1;
            *pcVar3 = cVar1;
          }
        }
LAB_004ab8bf:
        while( true ) {
          pcVar5 = this->regparse;
          cVar1 = *pcVar5;
          if (cVar1 == '-') break;
          if ((cVar1 == '\0') || (cVar1 == ']')) {
            pcVar3 = this->regcode;
            if (pcVar3 == &regdummy) {
              this->regsize = this->regsize + 1;
            }
            else {
              this->regcode = pcVar3 + 1;
              *pcVar3 = '\0';
              pcVar5 = this->regparse;
            }
            if (*pcVar5 != ']') {
              pcVar5 = "RegularExpression::compile(): Unmatched [].";
              goto LAB_004ab704;
            }
            this->regparse = pcVar5 + 1;
            goto LAB_004ab99e;
          }
          this->regparse = pcVar5 + 1;
          pcVar3 = this->regcode;
          if (pcVar3 == &regdummy) {
LAB_004ab923:
            this->regsize = this->regsize + 1;
          }
          else {
            cVar1 = *pcVar5;
            this->regcode = pcVar3 + 1;
            *pcVar3 = cVar1;
          }
        }
        this->regparse = pcVar5 + 1;
        bVar2 = pcVar5[1];
        if ((bVar2 == 0x5d) || (bVar2 == 0)) {
          pcVar5 = this->regcode;
          if (pcVar5 == &regdummy) goto LAB_004ab923;
          this->regcode = pcVar5 + 1;
          *pcVar5 = '-';
          goto LAB_004ab8bf;
        }
        uVar8 = (uint)(byte)pcVar5[-1];
        if ((byte)pcVar5[-1] <= bVar2) {
          for (; bVar2 != uVar8; uVar8 = uVar8 + 1) {
            pcVar5 = this->regcode;
            if (pcVar5 == &regdummy) {
              this->regsize = this->regsize + 1;
            }
            else {
              this->regcode = pcVar5 + 1;
              *pcVar5 = (char)uVar8 + '\x01';
            }
          }
          this->regparse = this->regparse + 1;
          goto LAB_004ab8bf;
        }
        pcVar5 = "RegularExpression::compile(): Invalid range in [].";
        goto LAB_004ab704;
      }
      if (cVar1 == '\\') {
        if (*pcVar5 != '\0') {
          pcVar7 = regnode(this,'\b');
          pcVar5 = this->regparse;
          pcVar3 = this->regcode;
          this->regparse = pcVar5 + 1;
          if (pcVar3 == &regdummy) {
            this->regsize = this->regsize + 1;
          }
          else {
            cVar1 = *pcVar5;
            this->regcode = pcVar3 + 1;
            *pcVar3 = cVar1;
            pcVar5 = this->regcode;
            if (pcVar5 != &regdummy) {
              this->regcode = pcVar5 + 1;
              *pcVar5 = '\0';
              goto LAB_004ab99e;
            }
          }
          this->regsize = this->regsize + 1;
          goto LAB_004ab99e;
        }
        pcVar5 = "RegularExpression::compile(): Trailing backslash.";
        goto LAB_004ab704;
      }
      if (cVar1 != '|') {
        if (cVar1 == '^') {
          cStack_30 = '\x01';
          goto LAB_004ab6b0;
        }
        goto switchD_004ab683_caseD_25;
      }
    }
  }
  pcVar5 = "RegularExpression::compile(): Internal error.";
LAB_004ab704:
  puts(pcVar5);
  return (char *)0x0;
}

Assistant:

char* RegExpCompile::regatom(int* flagp)
{
  char* ret;
  int flags;

  *flagp = WORST; // Tentatively.

  switch (*regparse++) {
    case '^':
      ret = regnode(BOL);
      break;
    case '$':
      ret = regnode(EOL);
      break;
    case '.':
      ret = regnode(ANY);
      *flagp |= HASWIDTH | SIMPLE;
      break;
    case '[': {
      int rxpclass;
      int rxpclassend;

      if (*regparse == '^') { // Complement of range.
        ret = regnode(ANYBUT);
        regparse++;
      } else
        ret = regnode(ANYOF);
      if (*regparse == ']' || *regparse == '-')
        regc(*regparse++);
      while (*regparse != '\0' && *regparse != ']') {
        if (*regparse == '-') {
          regparse++;
          if (*regparse == ']' || *regparse == '\0')
            regc('-');
          else {
            rxpclass = UCHARAT(regparse - 2) + 1;
            rxpclassend = UCHARAT(regparse);
            if (rxpclass > rxpclassend + 1) {
              // RAISE Error, SYM(RegularExpression), SYM(Invalid_Range),
              printf("RegularExpression::compile(): Invalid range in [].\n");
              return nullptr;
            }
            for (; rxpclass <= rxpclassend; rxpclass++)
              regc(static_cast<char>(rxpclass));
            regparse++;
          }
        } else
          regc(*regparse++);
      }
      regc('\0');
      if (*regparse != ']') {
        // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Bracket),
        printf("RegularExpression::compile(): Unmatched [].\n");
        return nullptr;
      }
      regparse++;
      *flagp |= HASWIDTH | SIMPLE;
    } break;
    case '(':
      ret = reg(1, &flags);
      if (ret == nullptr)
        return (nullptr);
      *flagp |= flags & (HASWIDTH | SPSTART);
      break;
    case '\0':
    case '|':
    case ')':
      // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
      printf("RegularExpression::compile(): Internal error.\n"); // Never here
      return nullptr;
    case '?':
    case '+':
    case '*':
      // RAISE Error, SYM(RegularExpression), SYM(No_Operand),
      printf("RegularExpression::compile(): ?+* follows nothing.\n");
      return nullptr;
    case '\\':
      if (*regparse == '\0') {
        // RAISE Error, SYM(RegularExpression), SYM(Trailing_Backslash),
        printf("RegularExpression::compile(): Trailing backslash.\n");
        return nullptr;
      }
      ret = regnode(EXACTLY);
      regc(*regparse++);
      regc('\0');
      *flagp |= HASWIDTH | SIMPLE;
      break;
    default: {
      int len;
      char ender;

      regparse--;
      len = int(strcspn(regparse, META));
      if (len <= 0) {
        // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
        printf("RegularExpression::compile(): Internal error.\n");
        return nullptr;
      }
      ender = *(regparse + len);
      if (len > 1 && ISMULT(ender))
        len--; // Back off clear of ?+* operand.
      *flagp |= HASWIDTH;
      if (len == 1)
        *flagp |= SIMPLE;
      ret = regnode(EXACTLY);
      while (len > 0) {
        regc(*regparse++);
        len--;
      }
      regc('\0');
    } break;
  }
  return (ret);
}